

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O2

string * __thiscall
deqp::RobustBufferAccessBehavior::TexelFetchTest::getVertexShader_abi_cxx11_
          (string *__return_storage_ptr__,TexelFetchTest *this)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 430 core\n\nvoid main()\n{\n    gl_Position = vec4(0, 0, 0, 1);\n}\n\n",
             &local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string TexelFetchTest::getVertexShader()
{
	return std::string("#version 430 core\n"
					   "\n"
					   "void main()\n"
					   "{\n"
					   "    gl_Position = vec4(0, 0, 0, 1);\n"
					   "}\n"
					   "\n");
}